

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

int parse_args_SINCOS(Context *ctx)

{
  int iVar1;
  Context *ctx_local;
  
  iVar1 = shader_version_atleast(ctx,'\x03','\0');
  if (iVar1 == 0) {
    ctx_local._4_4_ = parse_args_DSSS(ctx);
  }
  else {
    ctx_local._4_4_ = parse_args_DS(ctx);
  }
  return ctx_local._4_4_;
}

Assistant:

static int parse_args_SINCOS(Context *ctx)
{
    // this opcode needs extra registers for sm2 and lower.
    if (!shader_version_atleast(ctx, 3, 0))
        return parse_args_DSSS(ctx);
    return parse_args_DS(ctx);
}